

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_rkv.c
# Opt level: O1

MPP_RET jpegd_write_rkv_htbl(JpegdHalCtx *ctx,JpegdSyntax *jpegd_syntax)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  short sVar8;
  int iVar9;
  uint uVar10;
  undefined2 uVar11;
  RK_U16 *pRVar12;
  long lVar13;
  RK_U16 min_code_dc [16];
  RK_U16 min_code_ac [16];
  void *htbl_ptr [6];
  RK_U16 acc_addr_dc [16];
  RK_U16 acc_addr_ac [16];
  RK_U8 htbl_value [192];
  
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","enter\n","jpegd_write_rkv_htbl");
  }
  htbl_ptr[4] = (void *)0x0;
  htbl_ptr[5] = (void *)0x0;
  htbl_ptr[2] = (void *)0x0;
  htbl_ptr[3] = (void *)0x0;
  htbl_ptr[0] = (void *)0x0;
  htbl_ptr[1] = (void *)0x0;
  pvVar3 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
  pvVar4 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
  min_code_ac[8] = 0;
  min_code_ac[9] = 0;
  min_code_ac[10] = 0;
  min_code_ac[0xb] = 0;
  min_code_ac[0xc] = 0;
  min_code_ac[0xd] = 0;
  min_code_ac[0xe] = 0;
  min_code_ac[0xf] = 0;
  min_code_ac[0] = 0;
  min_code_ac[1] = 0;
  min_code_ac[2] = 0;
  min_code_ac[3] = 0;
  min_code_ac[4] = 0;
  min_code_ac[5] = 0;
  min_code_ac[6] = 0;
  min_code_ac[7] = 0;
  min_code_dc[8] = 0;
  min_code_dc[9] = 0;
  min_code_dc[10] = 0;
  min_code_dc[0xb] = 0;
  min_code_dc[0xc] = 0;
  min_code_dc[0xd] = 0;
  min_code_dc[0xe] = 0;
  min_code_dc[0xf] = 0;
  min_code_dc[0] = 0;
  min_code_dc[1] = 0;
  min_code_dc[2] = 0;
  min_code_dc[3] = 0;
  min_code_dc[4] = 0;
  min_code_dc[5] = 0;
  min_code_dc[6] = 0;
  min_code_dc[7] = 0;
  acc_addr_ac[8] = 0;
  acc_addr_ac[9] = 0;
  acc_addr_ac[10] = 0;
  acc_addr_ac[0xb] = 0;
  acc_addr_ac[0xc] = 0;
  acc_addr_ac[0xd] = 0;
  acc_addr_ac[0xe] = 0;
  acc_addr_ac[0xf] = 0;
  acc_addr_ac[0] = 0;
  acc_addr_ac[1] = 0;
  acc_addr_ac[2] = 0;
  acc_addr_ac[3] = 0;
  acc_addr_ac[4] = 0;
  acc_addr_ac[5] = 0;
  acc_addr_ac[6] = 0;
  acc_addr_ac[7] = 0;
  acc_addr_dc[8] = 0;
  acc_addr_dc[9] = 0;
  acc_addr_dc[10] = 0;
  acc_addr_dc[0xb] = 0;
  acc_addr_dc[0xc] = 0;
  acc_addr_dc[0xd] = 0;
  acc_addr_dc[0xe] = 0;
  acc_addr_dc[0xf] = 0;
  acc_addr_dc[0] = 0;
  acc_addr_dc[1] = 0;
  acc_addr_dc[2] = 0;
  acc_addr_dc[3] = 0;
  acc_addr_dc[4] = 0;
  acc_addr_dc[5] = 0;
  acc_addr_dc[6] = 0;
  acc_addr_dc[7] = 0;
  memset(htbl_value,0,0xc0);
  htbl_ptr[0] = jpegd_syntax->dc_table + jpegd_syntax->dc_index[0];
  htbl_ptr[1] = jpegd_syntax->ac_table + jpegd_syntax->ac_index[0];
  htbl_ptr[2] = jpegd_syntax->dc_table + jpegd_syntax->dc_index[1];
  htbl_ptr[3] = jpegd_syntax->ac_table + jpegd_syntax->ac_index[1];
  htbl_ptr[4] = jpegd_syntax->dc_table + jpegd_syntax->dc_index[1];
  htbl_ptr[5] = jpegd_syntax->ac_table + jpegd_syntax->ac_index[1];
  if (jpegd_syntax->nb_components != 0) {
    pRVar12 = (RK_U16 *)((long)pvVar4 + 0x180);
    lVar13 = (long)pvVar3 + 0x2c0;
    uVar5 = 0;
    do {
      uVar6 = (ulong)(uint)((int)uVar5 * 2);
      pvVar3 = htbl_ptr[uVar6];
      pvVar4 = htbl_ptr[uVar6 + 1];
      min_code_dc._0_8_ = min_code_dc._0_8_ & 0xffffffffffff0000;
      acc_addr_dc._0_8_ = acc_addr_dc._0_8_ & 0xffffffffffff0000;
      lVar7 = 0;
      iVar9 = 0;
      uVar10 = 0;
      do {
        iVar1 = *(int *)((long)pvVar3 + lVar7 * 2);
        uVar11 = (undefined2)uVar10;
        if (((lVar7 != 0) && (iVar1 == 0)) &&
           (uVar2 = (uint)*(ushort *)((long)min_code_dc + lVar7 + -2) * 2,
           (uVar10 & 0xffff) <= uVar2)) {
          uVar11 = (undefined2)uVar2;
        }
        *(undefined2 *)((long)min_code_dc + lVar7) = uVar11;
        iVar9 = iVar9 + iVar1;
        *(short *)((long)acc_addr_dc + lVar7) = (short)iVar9;
        uVar10 = (uVar10 + iVar1) * 2;
        lVar7 = lVar7 + 2;
      } while (lVar7 != 0x20);
      sVar8 = (short)*(int *)((long)pvVar3 + 0x3c) + -1;
      if (*(int *)((long)pvVar3 + 0x3c) == 0) {
        sVar8 = 0;
      }
      min_code_dc[0] = sVar8 + min_code_dc[0xf];
      lVar7 = 0;
      min_code_ac._0_8_ = min_code_ac._0_8_ & 0xffffffffffff0000;
      acc_addr_ac._0_8_ = acc_addr_ac._0_8_ & 0xffffffffffff0000;
      iVar9 = 0;
      uVar10 = 0;
      do {
        iVar1 = *(int *)((long)pvVar4 + lVar7 * 2);
        uVar11 = (undefined2)uVar10;
        if (((lVar7 != 0) && (iVar1 == 0)) &&
           (uVar2 = (uint)*(ushort *)((long)min_code_dc + lVar7 + 0x1e) * 2,
           (uVar10 & 0xffff) <= uVar2)) {
          uVar11 = (undefined2)uVar2;
        }
        *(undefined2 *)((long)min_code_ac + lVar7) = uVar11;
        iVar9 = iVar9 + iVar1;
        *(short *)((long)acc_addr_ac + lVar7) = (short)iVar9;
        uVar10 = (uVar10 + iVar1) * 2;
        lVar7 = lVar7 + 2;
      } while (lVar7 != 0x20);
      sVar8 = (short)*(int *)((long)pvVar4 + 0x3c) + -1;
      if (*(int *)((long)pvVar4 + 0x3c) == 0) {
        sVar8 = 0;
      }
      min_code_ac[0] = sVar8 + min_code_ac[0xf];
      lVar7 = 0;
      do {
        *(undefined2 *)((long)pRVar12 + lVar7) = *(undefined2 *)((long)min_code_dc + lVar7);
        lVar7 = lVar7 + 2;
      } while (lVar7 != 0x20);
      pRVar12 = pRVar12 + 0x10;
      lVar7 = 0;
      do {
        *pRVar12 = *(short *)((long)acc_addr_dc + lVar7 + 2) << 8 |
                   *(ushort *)((long)acc_addr_dc + lVar7);
        pRVar12 = pRVar12 + 1;
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x20);
      lVar7 = 0;
      do {
        *pRVar12 = min_code_ac[lVar7];
        pRVar12 = pRVar12 + 1;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x10);
      lVar7 = 0;
      do {
        *pRVar12 = acc_addr_ac[lVar7 * 2 + 1] << 8 | acc_addr_ac[lVar7 * 2];
        pRVar12 = pRVar12 + 1;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 8);
      lVar7 = 0;
      do {
        htbl_value[lVar7] = *(RK_U8 *)((long)pvVar3 + lVar7 * 4 + 0x40);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0xc);
      lVar7 = 0x10;
      do {
        htbl_value[lVar7] = *(RK_U8 *)((long)pvVar4 + lVar7 * 4);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0xb2);
      lVar7 = 0;
      do {
        *(RK_U8 *)(lVar13 + lVar7) = htbl_value[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0xc0);
      uVar5 = uVar5 + 1;
      lVar13 = lVar13 + 0xc0;
    } while (uVar5 < jpegd_syntax->nb_components);
  }
  if ((jpegd_debug._1_1_ & 1) != 0) {
    pvVar3 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
    _mpp_log_l(4,"hal_jpegd_rkv","--------------huffman value tbl----------------------\n",
               (char *)0x0);
    uVar5 = 0xfffffffffffffff8;
    do {
      _mpp_log_l(4,"hal_jpegd_rkv","%02x%02x%02x%02x%02x%02x%02x%02x\n",(char *)0x0,
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x2cf),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x2ce),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x2cd),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x2cc),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x2cb),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x2ca),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x2c9),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x2c8));
      uVar5 = uVar5 + 8;
    } while (uVar5 < 0x238);
    pvVar3 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
    _mpp_log_l(4,"hal_jpegd_rkv","--------------huffman mincode tbl----------------------\n",
               (char *)0x0);
    uVar5 = 0xfffffffffffffff8;
    do {
      _mpp_log_l(4,"hal_jpegd_rkv","%02x%02x%02x%02x%02x%02x%02x%02x\n",(char *)0x0,
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 399),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x18e),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x18d),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x18c),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x18b),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x18a),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x189),
                 (ulong)*(byte *)((long)pvVar3 + uVar5 + 0x188));
      uVar5 = uVar5 + 8;
    } while (uVar5 < 0x118);
  }
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","exit\n","jpegd_write_rkv_htbl");
  }
  return MPP_OK;
}

Assistant:

MPP_RET jpegd_write_rkv_htbl(JpegdHalCtx *ctx, JpegdSyntax *jpegd_syntax)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;

    JpegdSyntax *s = jpegd_syntax;
    void * htbl_ptr[6] = {NULL};
    RK_U32 i, j, k = 0;
    RK_U8 *p_htbl_value = (RK_U8 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_VALUE_TBL_OFFSET;
    RK_U16 *p_htbl_mincode = (RK_U16 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_MINCODE_TBL_OFFSET  / 2;
    RK_U16 min_code_ac[16] = {0};
    RK_U16 min_code_dc[16] = {0};
    RK_U16 acc_addr_ac[16] = {0};
    RK_U16 acc_addr_dc[16] = {0};
    RK_U8 htbl_value[192] = {0};
    RK_U16 code = 0;
    RK_S32 addr = 0;
    RK_U32 len = 0;
    AcTable *ac_ptr;
    DcTable *dc_ptr;

    htbl_ptr[0] = &s->dc_table[s->dc_index[0]];
    htbl_ptr[1] = &s->ac_table[s->ac_index[0]];

    htbl_ptr[2] = &s->dc_table[s->dc_index[1]];
    htbl_ptr[3] = &s->ac_table[s->ac_index[1]];

    htbl_ptr[4] = htbl_ptr[2];
    htbl_ptr[5] = htbl_ptr[3];

    for (k = 0; k < s->nb_components; k++) {
        dc_ptr = (DcTable *)htbl_ptr[k * 2];
        ac_ptr = (AcTable *)htbl_ptr[k * 2 + 1];

        len = dc_ptr->bits[0];
        code = addr = 0;
        min_code_dc[0] = 0;
        acc_addr_dc[0] = 0;

        for (j = 0; j < 16; j++) {
            len = dc_ptr->bits[j];

            if (len == 0 && j > 0) {
                if (code > (min_code_dc[j - 1] << 1))
                    min_code_dc[j] = code;
                else
                    min_code_dc[j] = min_code_dc[j - 1] << 1;
            } else {
                min_code_dc[j] = code;
            }

            code += len;
            addr += len;
            acc_addr_dc[j] = addr;
            code <<= 1;

        }

        if (dc_ptr->bits[15])
            min_code_dc[0] = min_code_dc[15] + dc_ptr->bits[15] - 1;
        else
            min_code_dc[0] = min_code_dc[15];

        len = ac_ptr->bits[0];
        code = addr = 0;
        min_code_ac[0] = 0;
        acc_addr_ac[0] = 0;
        for (j = 0; j < 16; j++) {
            len = ac_ptr->bits[j];

            if (len == 0 && j > 0) {
                if (code > (min_code_ac[j - 1] << 1))
                    min_code_ac[j] = code;
                else
                    min_code_ac[j] = min_code_ac[j - 1] << 1;
            } else {
                min_code_ac[j] = code;
            }

            code += len;
            addr += len;
            acc_addr_ac[j] = addr;
            code <<= 1;
        }

        if (ac_ptr->bits[15])
            min_code_ac[0] = min_code_ac[15] + ac_ptr->bits[15] - 1;
        else
            min_code_ac[0] = min_code_ac[15];

        for (i = 0; i < 16; i++) {
            *p_htbl_mincode++ = min_code_dc[i];
        }

        for (i = 0; i < 8; i++) {
            *p_htbl_mincode++ = acc_addr_dc[2 * i] | acc_addr_dc[2 * i + 1] << 8;
        }

        for (i = 0; i < 16; i++) {
            *p_htbl_mincode++ = min_code_ac[i];
        }

        for (i = 0; i < 8; i++) {
            *p_htbl_mincode++ = acc_addr_ac[2 * i] | acc_addr_ac[2 * i + 1] << 8;
        }

        for (i = 0; i < MAX_DC_HUFFMAN_TABLE_LENGTH; i++) {
            htbl_value[i] = dc_ptr->vals[i];
        }

        for (i = 0; i < MAX_AC_HUFFMAN_TABLE_LENGTH; i++) {
            htbl_value[i + 16] = ac_ptr->vals[i];
        }

        for (i = 0; i < 12 * 16; i++) {
            *p_htbl_value++ = htbl_value[i];
        }
    }

    if (jpegd_debug & JPEGD_DBG_HAL_TBL) {
        RK_U8 *data = (RK_U8 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_VALUE_TBL_OFFSET;

        mpp_log("--------------huffman value tbl----------------------\n");
        for (i = 0; i < RKD_HUFFMAN_VALUE_TBL_SIZE; i += 8) {
            mpp_log("%02x%02x%02x%02x%02x%02x%02x%02x\n",
                    data[i + 7], data[i + 6], data[i + 5], data[i + 4],
                    data[i + 3], data[i + 2], data[i + 1], data[i + 0]);
        }

        data = NULL;
        data = (RK_U8 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_MINCODE_TBL_OFFSET;

        mpp_log("--------------huffman mincode tbl----------------------\n");
        for (i = 0; i < RKD_HUFFMAN_MINCODE_TBL_SIZE; i += 8) {
            mpp_log("%02x%02x%02x%02x%02x%02x%02x%02x\n",
                    data[i + 7], data[i + 6], data[i + 5], data[i + 4],
                    data[i + 3], data[i + 2], data[i + 1], data[i + 0]);
        }
    }

    jpegd_dbg_func("exit\n");
    return ret;
}